

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

protobuf_test_messages_proto3_TestAllTypesProto3 *
upb_test_optional_msg_ext(upb_test_TestExtensions *msg)

{
  protobuf_test_messages_proto3_TestAllTypesProto3 *ret;
  protobuf_test_messages_proto3_TestAllTypesProto3 *default_val;
  protobuf_test_messages_proto3_TestAllTypesProto3 *local_18;
  undefined8 local_10;
  
  if ((upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                  ,0xca4,
                  "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  if (0xbf < upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only.
             mode_dont_copy_me__upb_internal_use_only) {
    local_10 = 0;
    _upb_Message_GetExtensionField
              (&msg->base_dont_copy_me__upb_internal_use_only,&upb_test_optional_msg_ext_ext,
               &local_10,&local_18);
    return local_18;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                ,0xca6,
                "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
               );
}

Assistant:

UPB_INLINE const struct protobuf_test_messages_proto3_TestAllTypesProto3* upb_test_optional_msg_ext(const struct upb_test_TestExtensions* msg) {
  const upb_MiniTableExtension* ext = &upb_test_optional_msg_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  const struct protobuf_test_messages_proto3_TestAllTypesProto3* default_val = NULL;
  const struct protobuf_test_messages_proto3_TestAllTypesProto3* ret;
  _upb_Message_GetExtensionField((upb_Message*)msg, ext, &default_val, &ret);
  return ret;
}